

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BuildSystemExtensionManager.cpp
# Opt level: O2

BuildSystemExtension * __thiscall
llbuild::buildsystem::BuildSystemExtensionManager::lookupByCommandPath
          (BuildSystemExtensionManager *this,StringRef path)

{
  StringMap<std::unique_ptr<llbuild::buildsystem::BuildSystemExtension,_std::default_delete<llbuild::buildsystem::BuildSystemExtension>_>,_llvm::MallocAllocator>
  *this_00;
  BuildSystemExtension *pBVar1;
  POSIXEnvironment environment;
  ProcessAttributes attr;
  bool bVar2;
  iterator iVar3;
  unique_ptr<llbuild::buildsystem::BuildSystemExtension,_std::default_delete<llbuild::buildsystem::BuildSystemExtension>_>
  *puVar4;
  char *path_00;
  Handle handle;
  code *pcVar5;
  BuildSystemExtension *pBVar6;
  ArrayRef<llvm::StringRef> commandLine;
  undefined6 in_stack_fffffffffffff57a;
  undefined2 in_stack_fffffffffffff580;
  undefined6 in_stack_fffffffffffff582;
  undefined2 uVar7;
  undefined6 uVar8;
  undefined2 uVar9;
  undefined6 uVar10;
  ProcessCompletionFn completionFn;
  vector<llvm::StringRef,_std::allocator<llvm::StringRef>_> cmd;
  ProcessReleaseFn releaseFn;
  SmallString<256U> infoPath;
  POSIXEnvironment local_8d8;
  SmallString<1024U> extensionPath;
  CapturingProcessDelegate delegate;
  
  std::mutex::lock(&this->extensionsLock);
  this_00 = &this->extensions;
  iVar3 = llvm::
          StringMap<std::unique_ptr<llbuild::buildsystem::BuildSystemExtension,_std::default_delete<llbuild::buildsystem::BuildSystemExtension>_>,_llvm::MallocAllocator>
          ::find(this_00,path);
  if (iVar3.
      super_StringMapIterBase<llvm::StringMapIterator<std::unique_ptr<llbuild::buildsystem::BuildSystemExtension,_std::default_delete<llbuild::buildsystem::BuildSystemExtension>_>_>,_llvm::StringMapEntry<std::unique_ptr<llbuild::buildsystem::BuildSystemExtension,_std::default_delete<llbuild::buildsystem::BuildSystemExtension>_>_>_>
      .Ptr != (StringMapIterBase<llvm::StringMapIterator<std::unique_ptr<llbuild::buildsystem::BuildSystemExtension,_std::default_delete<llbuild::buildsystem::BuildSystemExtension>_>_>,_llvm::StringMapEntry<std::unique_ptr<llbuild::buildsystem::BuildSystemExtension,_std::default_delete<llbuild::buildsystem::BuildSystemExtension>_>_>_>
               )((this->extensions).super_StringMapImpl.TheTable +
                (this->extensions).super_StringMapImpl.NumBuckets)) {
    pBVar6 = *(BuildSystemExtension **)
              (*(long *)iVar3.
                        super_StringMapIterBase<llvm::StringMapIterator<std::unique_ptr<llbuild::buildsystem::BuildSystemExtension,_std::default_delete<llbuild::buildsystem::BuildSystemExtension>_>_>,_llvm::StringMapEntry<std::unique_ptr<llbuild::buildsystem::BuildSystemExtension,_std::default_delete<llbuild::buildsystem::BuildSystemExtension>_>_>_>
                        .Ptr + 8);
    goto LAB_00146dc7;
  }
  puVar4 = llvm::
           StringMap<std::unique_ptr<llbuild::buildsystem::BuildSystemExtension,_std::default_delete<llbuild::buildsystem::BuildSystemExtension>_>,_llvm::MallocAllocator>
           ::operator[](this_00,path);
  pBVar6 = (puVar4->_M_t).
           super___uniq_ptr_impl<llbuild::buildsystem::BuildSystemExtension,_std::default_delete<llbuild::buildsystem::BuildSystemExtension>_>
           ._M_t.
           super__Tuple_impl<0UL,_llbuild::buildsystem::BuildSystemExtension_*,_std::default_delete<llbuild::buildsystem::BuildSystemExtension>_>
           .super__Head_base<0UL,_llbuild::buildsystem::BuildSystemExtension_*,_false>._M_head_impl;
  (puVar4->_M_t).
  super___uniq_ptr_impl<llbuild::buildsystem::BuildSystemExtension,_std::default_delete<llbuild::buildsystem::BuildSystemExtension>_>
  ._M_t.
  super__Tuple_impl<0UL,_llbuild::buildsystem::BuildSystemExtension_*,_std::default_delete<llbuild::buildsystem::BuildSystemExtension>_>
  .super__Head_base<0UL,_llbuild::buildsystem::BuildSystemExtension_*,_false>._M_head_impl =
       (BuildSystemExtension *)0x0;
  if (pBVar6 != (BuildSystemExtension *)0x0) {
    (*pBVar6->_vptr_BuildSystemExtension[1])();
  }
  llvm::SmallVector<char,256u>::SmallVector<char_const*,void>
            (&infoPath.super_SmallVector<char,_256U>,path.Data,path.Data + path.Length);
  llvm::SmallVectorImpl<char>::append<char_const*,void>
            (&infoPath.super_SmallVector<char,_256U>.super_SmallVectorImpl<char>,"-for-llbuild","");
  llvm::Twine::Twine((Twine *)&delegate,
                     &infoPath.super_SmallVector<char,_256U>.super_SmallVectorImpl<char>);
  bVar2 = llvm::sys::fs::exists((Twine *)&delegate);
  if (bVar2) {
    delegate.output.super_SmallVector<char,_1024U>.super_SmallVectorImpl<char>.
    super_SmallVectorTemplateBase<char,_true>.super_SmallVectorTemplateCommon<char,_void>.
    super_SmallVectorBase.BeginX =
         &delegate.output.super_SmallVector<char,_1024U>.super_SmallVectorStorage<char,_1024U>;
    delegate.super_ProcessDelegate._vptr_ProcessDelegate =
         (_func_int **)&PTR__CapturingProcessDelegate_00203088;
    delegate.output.super_SmallVector<char,_1024U>.super_SmallVectorImpl<char>.
    super_SmallVectorTemplateBase<char,_true>.super_SmallVectorTemplateCommon<char,_void>.
    super_SmallVectorBase.Size = 0;
    delegate.output.super_SmallVector<char,_1024U>.super_SmallVectorImpl<char>.
    super_SmallVectorTemplateBase<char,_true>.super_SmallVectorTemplateCommon<char,_void>.
    super_SmallVectorBase.Capacity = 0x400;
    uVar7 = 0;
    uVar8 = 0;
    uVar9 = 0;
    uVar10 = 0;
    llbuild::basic::ProcessGroup::ProcessGroup((ProcessGroup *)&extensionPath);
    releaseFn.super__Function_base._M_functor._8_8_ =
         ZEXT48(infoPath.super_SmallVector<char,_256U>.super_SmallVectorImpl<char>.
                super_SmallVectorTemplateBase<char,_true>.
                super_SmallVectorTemplateCommon<char,_void>.super_SmallVectorBase.Size);
    releaseFn.super__Function_base._M_functor._M_unused._M_object =
         infoPath.super_SmallVector<char,_256U>.super_SmallVectorImpl<char>.
         super_SmallVectorTemplateBase<char,_true>.super_SmallVectorTemplateCommon<char,_void>.
         super_SmallVectorBase.BeginX;
    releaseFn.super__Function_base._M_manager = (_Manager_type)anon_var_dwarf_1b3ce1;
    releaseFn._M_invoker = (_Invoker_type)0x1b;
    cmd.super__Vector_base<llvm::StringRef,_std::allocator<llvm::StringRef>_>._M_impl.
    super__Vector_impl_data._M_start = (pointer)0x0;
    cmd.super__Vector_base<llvm::StringRef,_std::allocator<llvm::StringRef>_>._M_impl.
    super__Vector_impl_data._M_finish = (pointer)0x0;
    cmd.super__Vector_base<llvm::StringRef,_std::allocator<llvm::StringRef>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    std::vector<llvm::StringRef,std::allocator<llvm::StringRef>>::
    _M_range_initialize<llvm::StringRef_const*>
              ((vector<llvm::StringRef,std::allocator<llvm::StringRef>> *)&cmd);
    releaseFn.super__Function_base._M_functor._M_unused._M_object = (void *)0x0;
    releaseFn.super__Function_base._M_functor._8_8_ = 0;
    releaseFn._M_invoker =
         std::
         _Function_handler<void_(std::function<void_()>_&&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/apple[P]swift-llbuild/lib/BuildSystem/BuildSystemExtensionManager.cpp:82:34)>
         ::_M_invoke;
    releaseFn.super__Function_base._M_manager =
         std::
         _Function_handler<void_(std::function<void_()>_&&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/apple[P]swift-llbuild/lib/BuildSystem/BuildSystemExtensionManager.cpp:82:34)>
         ::_M_manager;
    completionFn.super__Function_base._M_functor._M_unused._M_object = (void *)0x0;
    completionFn.super__Function_base._M_functor._8_8_ = 0;
    completionFn._M_invoker =
         std::
         _Function_handler<void_(llbuild::basic::ProcessResult),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/apple[P]swift-llbuild/lib/BuildSystem/BuildSystemExtensionManager.cpp:83:40)>
         ::_M_invoke;
    completionFn.super__Function_base._M_manager =
         std::
         _Function_handler<void_(llbuild::basic::ProcessResult),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/apple[P]swift-llbuild/lib/BuildSystem/BuildSystemExtensionManager.cpp:83:40)>
         ::_M_manager;
    commandLine.Length =
         (long)cmd.super__Vector_base<llvm::StringRef,_std::allocator<llvm::StringRef>_>._M_impl.
               super__Vector_impl_data._M_finish -
         (long)cmd.super__Vector_base<llvm::StringRef,_std::allocator<llvm::StringRef>_>._M_impl.
               super__Vector_impl_data._M_start >> 4;
    local_8d8.keys._M_h._M_buckets = &local_8d8.keys._M_h._M_single_bucket;
    local_8d8.env.super__Vector_base<const_char_*,_std::allocator<const_char_*>_>._M_impl.
    super__Vector_impl_data._M_start = (pointer)0x0;
    local_8d8.env.super__Vector_base<const_char_*,_std::allocator<const_char_*>_>._M_impl.
    super__Vector_impl_data._M_finish = (pointer)0x0;
    local_8d8.env.super__Vector_base<const_char_*,_std::allocator<const_char_*>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    local_8d8.envStorage.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    local_8d8.envStorage.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    local_8d8.envStorage.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    local_8d8.keys._M_h._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
    local_8d8.keys._M_h._M_element_count = 0;
    local_8d8.keys._M_h._M_bucket_count = 1;
    local_8d8.keys._M_h._M_rehash_policy._M_max_load_factor = 1.0;
    local_8d8.keys._M_h._M_rehash_policy._4_4_ = 0;
    local_8d8.keys._M_h._M_rehash_policy._M_next_resize = 0;
    local_8d8.keys._M_h._M_single_bucket = (__node_base_ptr)0x0;
    local_8d8.isFrozen = false;
    environment.env.super__Vector_base<const_char_*,_std::allocator<const_char_*>_>._M_impl.
    super__Vector_impl_data._M_finish._2_6_ = in_stack_fffffffffffff582;
    environment.env.super__Vector_base<const_char_*,_std::allocator<const_char_*>_>._M_impl.
    super__Vector_impl_data._M_finish._0_2_ = 1;
    environment.env.super__Vector_base<const_char_*,_std::allocator<const_char_*>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage._2_6_ = uVar8;
    environment.env.super__Vector_base<const_char_*,_std::allocator<const_char_*>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage._0_2_ = uVar7;
    environment.envStorage.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_start._2_6_ = uVar10;
    environment.envStorage.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_start._0_2_ = uVar9;
    environment.envStorage.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_finish._2_6_ = in_stack_fffffffffffff57a;
    environment.envStorage.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_finish._0_2_ = 0x101;
    environment.env.super__Vector_base<const_char_*,_std::allocator<const_char_*>_>._M_impl.
    super__Vector_impl_data._M_start = (pointer)&local_8d8;
    environment.envStorage.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)&releaseFn;
    environment.keys._M_h._M_buckets = (__buckets_ptr)&completionFn;
    environment.keys._M_h._M_bucket_count._0_2_ = 1;
    environment.keys._M_h._M_bucket_count._2_6_ = in_stack_fffffffffffff582;
    environment.keys._M_h._M_before_begin._M_nxt._0_2_ = uVar7;
    environment.keys._M_h._M_before_begin._M_nxt._2_6_ = uVar8;
    environment.keys._M_h._M_element_count._0_2_ = uVar9;
    environment.keys._M_h._M_element_count._2_6_ = uVar10;
    environment.keys._M_h._M_rehash_policy._M_max_load_factor._0_2_ = 0x101;
    environment.keys._M_h._M_rehash_policy._2_6_ = in_stack_fffffffffffff57a;
    environment.keys._M_h._M_rehash_policy._M_next_resize._0_2_ = in_stack_fffffffffffff580;
    environment.keys._M_h._M_rehash_policy._M_next_resize._2_6_ = in_stack_fffffffffffff582;
    environment.keys._M_h._M_single_bucket._0_2_ = uVar7;
    environment.keys._M_h._M_single_bucket._2_6_ = uVar8;
    environment._104_2_ = uVar9;
    environment._106_6_ = uVar10;
    attr.workingDir.Length =
         (size_t)std::
                 _Function_handler<void_(llbuild::basic::ProcessResult),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/apple[P]swift-llbuild/lib/BuildSystem/BuildSystemExtensionManager.cpp:83:40)>
                 ::_M_manager;
    attr.canSafelyInterrupt = false;
    attr.connectToConsole = false;
    attr._2_6_ = 0;
    attr.workingDir.Data = (char *)0x0;
    attr._24_8_ = std::
                  _Function_handler<void_(llbuild::basic::ProcessResult),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/apple[P]swift-llbuild/lib/BuildSystem/BuildSystemExtensionManager.cpp:83:40)>
                  ::_M_invoke;
    commandLine.Data =
         cmd.super__Vector_base<llvm::StringRef,_std::allocator<llvm::StringRef>_>._M_impl.
         super__Vector_impl_data._M_start;
    llbuild::basic::spawnProcess
              (&delegate.super_ProcessDelegate,(ProcessContext *)0x0,(ProcessGroup *)&extensionPath,
               (ProcessHandle)0x0,commandLine,environment,attr,
               (ProcessReleaseFn *)
               cmd.super__Vector_base<llvm::StringRef,_std::allocator<llvm::StringRef>_>._M_impl.
               super__Vector_impl_data._M_start,
               (ProcessCompletionFn *)
               cmd.super__Vector_base<llvm::StringRef,_std::allocator<llvm::StringRef>_>._M_impl.
               super__Vector_impl_data._M_finish);
    llbuild::basic::POSIXEnvironment::~POSIXEnvironment(&local_8d8);
    if (completionFn.super__Function_base._M_manager != (_Manager_type)0x0) {
      (*completionFn.super__Function_base._M_manager)
                ((_Any_data *)&completionFn,(_Any_data *)&completionFn,__destroy_functor);
    }
    if (releaseFn.super__Function_base._M_manager != (_Manager_type)0x0) {
      (*releaseFn.super__Function_base._M_manager)
                ((_Any_data *)&releaseFn,(_Any_data *)&releaseFn,__destroy_functor);
    }
    std::_Vector_base<llvm::StringRef,_std::allocator<llvm::StringRef>_>::~_Vector_base
              (&cmd.super__Vector_base<llvm::StringRef,_std::allocator<llvm::StringRef>_>);
    llbuild::basic::ProcessGroup::~ProcessGroup((ProcessGroup *)&extensionPath);
    llvm::SmallVector<char,_1024U>::SmallVector
              (&extensionPath.super_SmallVector<char,_1024U>,
               &delegate.output.super_SmallVector<char,_1024U>);
    if (delegate.success == true) {
      llvm::Twine::Twine((Twine *)&releaseFn,(SmallVectorImpl<char> *)&infoPath);
      bVar2 = llvm::sys::fs::exists((Twine *)&releaseFn);
      if (!bVar2) goto LAB_00146d9d;
      path_00 = llvm::SmallString<1024U>::c_str(&extensionPath);
      handle = llbuild::basic::sys::OpenLibrary(path_00);
      if (handle == (Handle)0x0) goto LAB_00146d9d;
      pcVar5 = (code *)llbuild::basic::sys::GetSymbolByname
                                 (handle,"initialize_llbuild_buildsystem_extension_v0");
      if (pcVar5 == (code *)0x0) {
LAB_00146d95:
        llbuild::basic::sys::CloseLibrary(handle);
        goto LAB_00146d9d;
      }
      pBVar6 = (BuildSystemExtension *)(*pcVar5)();
      if (pBVar6 == (BuildSystemExtension *)0x0) goto LAB_00146d95;
      puVar4 = llvm::
               StringMap<std::unique_ptr<llbuild::buildsystem::BuildSystemExtension,_std::default_delete<llbuild::buildsystem::BuildSystemExtension>_>,_llvm::MallocAllocator>
               ::operator[](this_00,path);
      pBVar1 = (puVar4->_M_t).
               super___uniq_ptr_impl<llbuild::buildsystem::BuildSystemExtension,_std::default_delete<llbuild::buildsystem::BuildSystemExtension>_>
               ._M_t.
               super__Tuple_impl<0UL,_llbuild::buildsystem::BuildSystemExtension_*,_std::default_delete<llbuild::buildsystem::BuildSystemExtension>_>
               .super__Head_base<0UL,_llbuild::buildsystem::BuildSystemExtension_*,_false>.
               _M_head_impl;
      (puVar4->_M_t).
      super___uniq_ptr_impl<llbuild::buildsystem::BuildSystemExtension,_std::default_delete<llbuild::buildsystem::BuildSystemExtension>_>
      ._M_t.
      super__Tuple_impl<0UL,_llbuild::buildsystem::BuildSystemExtension_*,_std::default_delete<llbuild::buildsystem::BuildSystemExtension>_>
      .super__Head_base<0UL,_llbuild::buildsystem::BuildSystemExtension_*,_false>._M_head_impl =
           pBVar6;
      if (pBVar1 != (BuildSystemExtension *)0x0) {
        (*pBVar1->_vptr_BuildSystemExtension[1])();
      }
    }
    else {
LAB_00146d9d:
      pBVar6 = (BuildSystemExtension *)0x0;
    }
    llvm::SmallVectorImpl<char>::~SmallVectorImpl((SmallVectorImpl<char> *)&extensionPath);
    lookupByCommandPath::CapturingProcessDelegate::~CapturingProcessDelegate(&delegate);
  }
  else {
    pBVar6 = (BuildSystemExtension *)0x0;
  }
  llvm::SmallVectorImpl<char>::~SmallVectorImpl((SmallVectorImpl<char> *)&infoPath);
LAB_00146dc7:
  pthread_mutex_unlock((pthread_mutex_t *)this);
  return pBVar6;
}

Assistant:

BuildSystemExtension*
BuildSystemExtensionManager::lookupByCommandPath(StringRef path) {
  std::lock_guard<std::mutex> guard(extensionsLock);

  // Check the cache.
  auto it = extensions.find(path);
  if (it != extensions.end()) return it->second.get();

  // Register negative hit, unless we succeed.
  extensions[path] = nullptr;

  // If missing, look for an extension for this path.
  //
  // Currently, extensions are discovered by expecting that a command has an
  // adjacent "...-for-llbuild" binary which can be queried for info.
  SmallString<256> infoPath{ path };
  infoPath += "-for-llbuild";
  if (!llvm::sys::fs::exists(infoPath)) {
    return {};
  }

  // If the path exists, then query it to find the actual extension library.
  struct CapturingProcessDelegate: ProcessDelegate {
    SmallString<1024> output;
    bool success;
    
    virtual void processStarted(ProcessContext* ctx, ProcessHandle handle,
                                llbuild_pid_t pid) {}

    virtual void processHadError(ProcessContext* ctx, ProcessHandle handle,
                                 const Twine& message) {};

    virtual void processHadOutput(ProcessContext* ctx, ProcessHandle handle,
                                  StringRef data) {
      output += data;
    };

    virtual void processFinished(ProcessContext* ctx, ProcessHandle handle,
                                 const ProcessResult& result) {
      success = (result.status == ProcessStatus::Succeeded &&
                 result.exitCode == 0);
    }
  };
  CapturingProcessDelegate delegate;
  {
    // FIXME: Add a utility for capturing a subprocess infocation.
    ProcessAttributes attr{/*canSafelyInterrupt=*/true};
    ProcessGroup pgrp;
    ProcessHandle handle{0};
    std::vector<StringRef> cmd{infoPath, "--llbuild-extension-version", "0",
        "--extension-path" };
    ProcessReleaseFn releaseFn = [](std::function<void()>&& pwait){ pwait(); };
    ProcessCompletionFn completionFn = [](ProcessResult){};
    spawnProcess(delegate, nullptr, pgrp, handle, cmd, POSIXEnvironment(), attr,
                 std::move(releaseFn), std::move(completionFn));
  }

  // The output is expected to be the exact path to the extension (no extra
  // whitespace, etc.).
  auto extensionPath = delegate.output;
  if (!delegate.success || !llvm::sys::fs::exists(infoPath)) {
    return {};
  }

  // Load the plugin.
  auto handle = sys::OpenLibrary(extensionPath.c_str());
  if (handle == nullptr)
    return {};

  BuildSystemExtension *(*registrationFn)(void) =
      reinterpret_cast<decltype(registrationFn)>(sys::GetSymbolByname(handle,
                                                                      "initialize_llbuild_buildsystem_extension_v0"));
  if (!registrationFn) {
    sys::CloseLibrary(handle);
    return {};
  }

  // For now, we expect the registration to simply allocate and return us a (C)
  // extension instance.
  //
  // FIXME: This needs to be reworked to go through a C API.
  auto *extension = registrationFn();
  if (!extension) {
    sys::CloseLibrary(handle);
    return {};
  }

  extensions[path] = std::unique_ptr<BuildSystemExtension>(extension);
  return extension;
}